

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void append_slash(char *name)

{
  size_t sVar1;
  char *pcVar2;
  char *ptr;
  char *name_local;
  
  if (*name != '\0') {
    sVar1 = strlen(name);
    pcVar2 = name + (sVar1 - 1);
    if (*pcVar2 != '/') {
      pcVar2[1] = '/';
      pcVar2[2] = '\0';
    }
  }
  return;
}

Assistant:

void append_slash(char *name)
{
#if defined(WIN32)
    static const char dirsep = '\\';
#else
    static const char dirsep = '/';
#endif
    char *ptr;

    if (!*name)
	return;
    ptr = name + (strlen(name) - 1);
    if (*ptr != dirsep) {
	*++ptr = dirsep;
	*++ptr = '\0';
    }
    return;
}